

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeChangeEncoding(Mem *pMem,int desiredEnc)

{
  undefined2 uVar1;
  int iVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ushort *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  ushort *puVar14;
  ushort *puVar15;
  int iVar16;
  
  iVar16 = 0;
  if ((pMem->flags & 2) != 0) {
    iVar16 = 0;
    if ((uint)pMem->enc != desiredEnc) {
      if (desiredEnc == 1 || pMem->enc == 1) {
        if (desiredEnc == 1) {
          uVar5 = pMem->n & 0xfffffffe;
          pMem->n = uVar5;
          iVar4 = uVar5 * 2 + 1;
        }
        else {
          iVar4 = pMem->n * 2 + 2;
        }
        puVar14 = (ushort *)pMem->z;
        iVar2 = pMem->n;
        pbVar8 = (byte *)sqlite3DbMallocRaw(pMem->db,iVar4);
        if (pbVar8 == (byte *)0x0) {
          iVar16 = 7;
        }
        else {
          puVar7 = (ushort *)((long)iVar2 + (long)puVar14);
          if (pMem->enc == '\x01') {
            pbVar9 = pbVar8;
            if (desiredEnc == 2) {
              if (0 < iVar2) {
                do {
                  bVar10 = (byte)*puVar14;
                  uVar6 = (ulong)bVar10;
                  puVar14 = (ushort *)((long)puVar14 + 1);
                  if (0xbf < bVar10) {
                    uVar5 = (uint)""[bVar10 - 0xc0];
                    while ((puVar14 != puVar7 &&
                           (uVar3 = *puVar14, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
                      puVar14 = (ushort *)((long)puVar14 + 1);
                      uVar5 = uVar5 << 6 | (byte)uVar3 & 0x3f;
                    }
                    uVar6 = (ulong)uVar5;
                    if ((uVar5 & 0xfffff800) == 0xd800) {
                      uVar6 = 0xfffd;
                    }
                    if (uVar5 < 0x80) {
                      uVar6 = 0xfffd;
                    }
                    if ((uVar5 & 0xfffffffe) == 0xfffe) {
                      uVar6 = 0xfffd;
                    }
                  }
                  if ((uint)uVar6 < 0x10000) {
                    *(short *)pbVar9 = (short)uVar6;
                    pbVar9 = pbVar9 + 2;
                  }
                  else {
                    uVar5 = (uint)uVar6 - 0x10000;
                    *pbVar9 = (byte)(uVar5 >> 10) & 0xc0 | (byte)(uVar6 >> 10) & 0x3f;
                    pbVar9[1] = (byte)(uVar5 >> 0x12) & 3 | 0xd8;
                    pbVar9[2] = (byte)uVar6;
                    pbVar9[3] = (byte)(uVar6 >> 8) & 3 | 0xdc;
                    pbVar9 = pbVar9 + 4;
                  }
                } while (puVar14 < puVar7);
              }
            }
            else if (0 < iVar2) {
              do {
                bVar10 = (byte)*puVar14;
                uVar5 = (uint)bVar10;
                puVar14 = (ushort *)((long)puVar14 + 1);
                if (0xbf < bVar10) {
                  uVar11 = (uint)""[bVar10 - 0xc0];
                  while ((puVar14 != puVar7 &&
                         (uVar3 = *puVar14, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
                    puVar14 = (ushort *)((long)puVar14 + 1);
                    uVar11 = uVar11 << 6 | (byte)uVar3 & 0x3f;
                  }
                  uVar5 = uVar11;
                  if ((uVar11 & 0xfffff800) == 0xd800) {
                    uVar5 = 0xfffd;
                  }
                  if (uVar11 < 0x80) {
                    uVar5 = 0xfffd;
                  }
                  if ((uVar11 & 0xfffffffe) == 0xfffe) {
                    uVar5 = 0xfffd;
                  }
                }
                bVar10 = (byte)(uVar5 >> 8);
                if (uVar5 < 0x10000) {
                  pbVar12 = pbVar9 + 1;
                  *pbVar9 = bVar10;
                  lVar13 = 2;
                }
                else {
                  *pbVar9 = (byte)(uVar5 - 0x10000 >> 0x12) & 3 | 0xd8;
                  pbVar9[1] = (byte)(uVar5 - 0x10000 >> 10) & 0xc0 | (byte)(uVar5 >> 10) & 0x3f;
                  pbVar12 = pbVar9 + 3;
                  pbVar9[2] = bVar10 & 3 | 0xdc;
                  lVar13 = 4;
                }
                pbVar9 = pbVar9 + lVar13;
                *pbVar12 = (byte)uVar5;
              } while (puVar14 < puVar7);
            }
            pMem->n = (int)pbVar9 - (int)pbVar8;
            *pbVar9 = 0;
            pbVar9 = pbVar9 + 1;
          }
          else {
            pbVar9 = pbVar8;
            if (pMem->enc == '\x02') {
              if (0 < iVar2) {
                do {
                  puVar15 = puVar14 + 1;
                  uVar5 = (uint)*puVar14;
                  if (puVar15 < puVar7 && (*puVar14 & 0xf800) == 0xd800) {
                    puVar15 = puVar14 + 2;
                    uVar5 = ((uVar5 & 0x3c0 | (byte)*puVar14 & 0x3f) << 10 | (uint)(byte)puVar14[1])
                            + (*(byte *)((long)puVar14 + 3) & 3) * 0x100 + 0x10000;
                  }
                  bVar10 = (byte)uVar5;
                  if (uVar5 < 0x80) {
                    *pbVar9 = bVar10;
                    pbVar9 = pbVar9 + 1;
                  }
                  else if (uVar5 < 0x800) {
                    *pbVar9 = (byte)(uVar5 >> 6) | 0xc0;
                    pbVar9[1] = bVar10 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 2;
                  }
                  else if (uVar5 < 0x10000) {
                    *pbVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
                    pbVar9[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                    pbVar9[2] = bVar10 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 3;
                  }
                  else {
                    *pbVar9 = (byte)(uVar5 >> 0x12) | 0xf0;
                    pbVar9[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                    pbVar9[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                    pbVar9[3] = bVar10 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 4;
                  }
                  puVar14 = puVar15;
                } while (puVar15 < puVar7);
              }
            }
            else if (0 < iVar2) {
              do {
                puVar15 = puVar14 + 1;
                uVar5 = (uint)CONCAT11((byte)*puVar14,*(byte *)((long)puVar14 + 1));
                if (puVar15 < puVar7 && ((byte)*puVar14 & 0xf8) == 0xd8) {
                  puVar15 = puVar14 + 2;
                  uVar5 = ((uVar5 & 0x3c0 | *(byte *)((long)puVar14 + 1) & 0x3f) << 10 |
                          (uint)*(byte *)((long)puVar14 + 3)) + ((byte)puVar14[1] & 3) * 0x100 +
                          0x10000;
                }
                bVar10 = (byte)uVar5;
                if (uVar5 < 0x80) {
                  *pbVar9 = bVar10;
                  pbVar9 = pbVar9 + 1;
                }
                else if (uVar5 < 0x800) {
                  *pbVar9 = (byte)(uVar5 >> 6) | 0xc0;
                  pbVar9[1] = bVar10 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 2;
                }
                else if (uVar5 < 0x10000) {
                  *pbVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
                  pbVar9[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                  pbVar9[2] = bVar10 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 3;
                }
                else {
                  *pbVar9 = (byte)(uVar5 >> 0x12) | 0xf0;
                  pbVar9[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                  pbVar9[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                  pbVar9[3] = bVar10 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 4;
                }
                puVar14 = puVar15;
              } while (puVar15 < puVar7);
            }
            pMem->n = (int)pbVar9 - (int)pbVar8;
          }
          *pbVar9 = 0;
          sqlite3VdbeMemRelease(pMem);
          uVar1 = pMem->flags;
          pMem->enc = (u8)desiredEnc;
          pMem->flags = uVar1 & 0xe7ff | 0x600;
          pMem->z = (char *)pbVar8;
          pMem->zMalloc = (char *)pbVar8;
        }
      }
      else {
        iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
        iVar16 = 7;
        if (iVar4 == 0) {
          uVar6 = (long)pMem->n & 0xfffffffffffffffe;
          if (0 < (int)uVar6) {
            puVar14 = (ushort *)pMem->z;
            puVar7 = (ushort *)(uVar6 + (long)puVar14);
            do {
              *puVar14 = *puVar14 << 8 | *puVar14 >> 8;
              puVar14 = puVar14 + 1;
            } while (puVar14 < puVar7);
          }
          pMem->enc = (u8)desiredEnc;
          iVar16 = 0;
        }
      }
    }
  }
  return iVar16;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeEncoding(Mem *pMem, int desiredEnc){
#ifndef SQLITE_OMIT_UTF16
  int rc;
#endif
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( desiredEnc==SQLITE_UTF8 || desiredEnc==SQLITE_UTF16LE
           || desiredEnc==SQLITE_UTF16BE );
  if( !(pMem->flags&MEM_Str) || pMem->enc==desiredEnc ){
    return SQLITE_OK;
  }
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
#ifdef SQLITE_OMIT_UTF16
  return SQLITE_ERROR;
#else

  /* MemTranslate() may return SQLITE_OK or SQLITE_NOMEM. If NOMEM is returned,
  ** then the encoding of the value may not have changed.
  */
  rc = sqlite3VdbeMemTranslate(pMem, (u8)desiredEnc);
  assert(rc==SQLITE_OK    || rc==SQLITE_NOMEM);
  assert(rc==SQLITE_OK    || pMem->enc!=desiredEnc);
  assert(rc==SQLITE_NOMEM || pMem->enc==desiredEnc);
  return rc;
#endif
}